

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasExtensionFromFile
               (Message *msg,FileDescriptor *file,Options *options,bool *has_opt_codesize_extension)

{
  FieldDescriptor *this;
  bool bVar1;
  FileOptions_OptimizeMode FVar2;
  int iVar3;
  Descriptor *pDVar4;
  Message *pMVar5;
  Reflection *this_00;
  pointer ppFVar6;
  int i;
  int index;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_58;
  pointer local_38;
  
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(msg->super_MessageLite)._vptr_MessageLite[0x11])();
  Reflection::ListFields(this_00,msg,&local_58);
  local_38 = local_58.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar6 = local_58.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_58.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_58.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = false;
  }
  else {
    do {
      this = *ppFVar6;
      pDVar4 = FieldDescriptor::message_type(this);
      if (pDVar4 != (Descriptor *)0x0) {
        if (((byte)this[1] & 8) != 0) {
          pDVar4 = FieldDescriptor::message_type(this);
          if (*(FileDescriptor **)(pDVar4 + 0x10) != file) {
            if ((has_opt_codesize_extension != (bool *)0x0) &&
               (FVar2 = GetOptimizeFor(*(FileDescriptor **)(pDVar4 + 0x10),options,(bool *)0x0),
               FVar2 == FileOptions_OptimizeMode_CODE_SIZE)) {
              *has_opt_codesize_extension = true;
            }
            goto LAB_0023f267;
          }
LAB_0023f2f0:
          bVar1 = true;
          goto LAB_0023f2fb;
        }
LAB_0023f267:
        if ((~(byte)this[1] & 0x60) == 0) {
          index = 0;
          while (iVar3 = Reflection::FieldSize(this_00,msg,this), index < iVar3) {
            pMVar5 = Reflection::GetRepeatedMessage(this_00,msg,this,index);
            bVar1 = HasExtensionFromFile(pMVar5,file,options,has_opt_codesize_extension);
            index = index + 1;
            if (bVar1) goto LAB_0023f2f0;
          }
        }
        else {
          pMVar5 = Reflection::GetMessage(this_00,msg,this,(MessageFactory *)0x0);
          bVar1 = HasExtensionFromFile(pMVar5,file,options,has_opt_codesize_extension);
          if (bVar1) goto LAB_0023f2f0;
        }
      }
      ppFVar6 = ppFVar6 + 1;
    } while (ppFVar6 != local_38);
    bVar1 = false;
  }
LAB_0023f2fb:
  if (local_58.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

static bool HasExtensionFromFile(const Message& msg, const FileDescriptor* file,
                                 const Options& options,
                                 bool* has_opt_codesize_extension) {
  std::vector<const FieldDescriptor*> fields;
  auto reflection = msg.GetReflection();
  reflection->ListFields(msg, &fields);
  for (auto field : fields) {
    const auto* field_msg = field->message_type();
    if (field_msg == nullptr) {
      // It so happens that enums Is_Valid are still generated so enums work.
      // Only messages have potential problems.
      continue;
    }
    // If this option has an extension set AND that extension is defined in the
    // same file we have bootstrap problem.
    if (field->is_extension()) {
      const auto* msg_extension_file = field->message_type()->file();
      if (msg_extension_file == file) return true;
      if (has_opt_codesize_extension &&
          GetOptimizeFor(msg_extension_file, options) ==
              FileOptions::CODE_SIZE) {
        *has_opt_codesize_extension = true;
      }
    }
    // Recurse in this field to see if there is a problem in there
    if (field->is_repeated()) {
      for (int i = 0; i < reflection->FieldSize(msg, field); i++) {
        if (HasExtensionFromFile(reflection->GetRepeatedMessage(msg, field, i),
                                 file, options, has_opt_codesize_extension)) {
          return true;
        }
      }
    } else {
      if (HasExtensionFromFile(reflection->GetMessage(msg, field), file,
                               options, has_opt_codesize_extension)) {
        return true;
      }
    }
  }
  return false;
}